

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O1

bool basisu::etc_block::get_diff_subblock_colors
               (color_rgba *pDst,uint16_t packed_color5,uint16_t packed_delta3,uint32_t table_idx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t uVar8;
  long lVar9;
  color_rgba result;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_2c;
  
  if (table_idx < 8) {
    lVar9 = (ulong)table_idx * 0x10;
    bVar1 = unpack_color5((color_rgba *)&local_2c.field_1,packed_color5,packed_delta3,true,0xff);
    uVar4 = (uint)local_2c.m_comps[0];
    uVar2 = (uint)local_2c.m_comps[1];
    iVar3 = *(int *)(g_etc1_inten_tables + lVar9);
    iVar7 = iVar3 + uVar2;
    iVar5 = iVar3 + (uint)local_2c.m_comps[2];
    iVar6 = iVar3 + uVar4;
    if (0xfe < (int)(iVar3 + uVar4)) {
      iVar6 = 0xff;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    uVar8 = (uint8_t)iVar7;
    if (iVar7 < 1) {
      uVar8 = '\0';
    }
    iVar7 = *(int *)(g_etc1_inten_tables + lVar9 + 4);
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    (pDst->field_0).m_comps[0] = (uint8_t)iVar6;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    (pDst->field_0).m_comps[1] = uVar8;
    (pDst->field_0).m_comps[2] = (uint8_t)iVar5;
    iVar6 = iVar7 + (uint)local_2c.m_comps[2];
    iVar3 = iVar7 + uVar4;
    if (0xfe < (int)(iVar7 + uVar4)) {
      iVar3 = 0xff;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    (pDst->field_0).m_comps[3] = 0xff;
    iVar5 = iVar7 + uVar2;
    if (0xfe < (int)(iVar7 + uVar2)) {
      iVar5 = 0xff;
    }
    pDst[1].field_0.m_comps[0] = (uint8_t)iVar3;
    uVar8 = (uint8_t)iVar5;
    if (iVar5 < 1) {
      uVar8 = '\0';
    }
    pDst[1].field_0.m_comps[1] = uVar8;
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    uVar8 = (uint8_t)iVar6;
    if (iVar6 < 1) {
      uVar8 = '\0';
    }
    pDst[1].field_0.m_comps[2] = uVar8;
    pDst[1].field_0.m_comps[3] = 0xff;
    iVar3 = *(int *)(g_etc1_inten_tables + lVar9 + 8);
    iVar7 = iVar3 + uVar4;
    iVar6 = iVar3 + (uint)local_2c.m_comps[2];
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    iVar5 = iVar3 + uVar2;
    if (0xfe < (int)(iVar3 + uVar2)) {
      iVar5 = 0xff;
    }
    pDst[2].field_0.m_comps[0] = (uint8_t)iVar7;
    uVar8 = (uint8_t)iVar5;
    if (iVar5 < 1) {
      uVar8 = '\0';
    }
    pDst[2].field_0.m_comps[1] = uVar8;
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    uVar8 = (uint8_t)iVar6;
    if (iVar6 < 1) {
      uVar8 = '\0';
    }
    pDst[2].field_0.m_comps[2] = uVar8;
    pDst[2].field_0.m_comps[3] = 0xff;
    iVar7 = *(int *)(g_etc1_inten_tables + lVar9 + 0xc);
    iVar6 = uVar4 + iVar7;
    iVar3 = uVar2 + iVar7;
    iVar7 = iVar7 + (uint)local_2c.m_comps[2];
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    uVar8 = (uint8_t)iVar6;
    if (iVar6 < 1) {
      uVar8 = '\0';
    }
    if (0xfe < iVar3) {
      iVar3 = 0xff;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    pDst[3].field_0.m_comps[0] = uVar8;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    pDst[3].field_0.m_comps[1] = (uint8_t)iVar3;
    pDst[3].field_0.m_comps[2] = (uint8_t)iVar7;
    pDst[3].field_0.m_comps[3] = 0xff;
    return bVar1;
  }
  __assert_fail("table_idx < cETC1IntenModifierValues",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x22e,
                "static bool basisu::etc_block::get_diff_subblock_colors(color_rgba *, uint16_t, uint16_t, uint32_t)"
               );
}

Assistant:

bool etc_block::get_diff_subblock_colors(color_rgba* pDst, uint16_t packed_color5, uint16_t packed_delta3, uint32_t table_idx)
	{
		assert(table_idx < cETC1IntenModifierValues);
		const int *pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

		uint32_t r, g, b;
		bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

		const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

		const int y0 = pInten_modifer_table[0];
		pDst[0].set(ir + y0, ig + y0, ib + y0, 255);

		const int y1 = pInten_modifer_table[1];
		pDst[1].set(ir + y1, ig + y1, ib + y1, 255);

		const int y2 = pInten_modifer_table[2];
		pDst[2].set(ir + y2, ig + y2, ib + y2, 255);

		const int y3 = pInten_modifer_table[3];
		pDst[3].set(ir + y3, ig + y3, ib + y3, 255);

		return success;
	}